

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-idle.c
# Opt level: O3

int run_test_idle_starvation(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uv_timer_t *loop;
  uv_loop_t *loop_00;
  uv_idle_t *puVar2;
  uv_check_t *puVar3;
  
  loop = (uv_timer_t *)uv_default_loop();
  iVar1 = uv_idle_init((uv_loop_t *)loop,&idle_handle);
  if (iVar1 == 0) {
    puVar2 = &idle_handle;
    iVar1 = uv_idle_start(&idle_handle,idle_cb);
    loop = (uv_timer_t *)puVar2;
    if (iVar1 != 0) goto LAB_0015a664;
    loop = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_check_init((uv_loop_t *)loop,&check_handle);
    if (iVar1 != 0) goto LAB_0015a669;
    puVar3 = &check_handle;
    iVar1 = uv_check_start(&check_handle,check_cb);
    loop = (uv_timer_t *)puVar3;
    if (iVar1 != 0) goto LAB_0015a66e;
    loop = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_timer_init((uv_loop_t *)loop,&timer_handle);
    if (iVar1 != 0) goto LAB_0015a673;
    loop = &timer_handle;
    iVar1 = uv_timer_start(&timer_handle,timer_cb,0x32,0);
    if (iVar1 != 0) goto LAB_0015a678;
    loop = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0015a67d;
    if (idle_cb_called < 1) goto LAB_0015a682;
    if (timer_cb_called != 1) goto LAB_0015a687;
    if (close_cb_called == 3) {
      loop_00 = uv_default_loop();
      uv_walk(loop_00,close_walk_cb,(void *)0x0);
      uv_run(loop_00,UV_RUN_DEFAULT);
      loop = (uv_timer_t *)uv_default_loop();
      iVar1 = uv_loop_close((uv_loop_t *)loop);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015a691;
    }
  }
  else {
    run_test_idle_starvation_cold_1();
LAB_0015a664:
    run_test_idle_starvation_cold_2();
LAB_0015a669:
    run_test_idle_starvation_cold_3();
LAB_0015a66e:
    run_test_idle_starvation_cold_4();
LAB_0015a673:
    run_test_idle_starvation_cold_5();
LAB_0015a678:
    run_test_idle_starvation_cold_6();
LAB_0015a67d:
    run_test_idle_starvation_cold_7();
LAB_0015a682:
    run_test_idle_starvation_cold_8();
LAB_0015a687:
    run_test_idle_starvation_cold_9();
  }
  run_test_idle_starvation_cold_10();
LAB_0015a691:
  run_test_idle_starvation_cold_11();
  if (loop == (uv_timer_t *)&idle_handle) {
    idle_cb_cold_2();
    return extraout_EAX;
  }
  idle_cb_cold_1();
  if (loop == (uv_timer_t *)&check_handle) {
    check_cb_cold_2();
    return extraout_EAX_00;
  }
  check_cb_cold_1();
  if (loop == &timer_handle) {
    timer_cb_cold_2();
    return extraout_EAX_01;
  }
  timer_cb_cold_1();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX_02;
}

Assistant:

TEST_IMPL(idle_starvation) {
  int r;

  r = uv_idle_init(uv_default_loop(), &idle_handle);
  ASSERT(r == 0);
  r = uv_idle_start(&idle_handle, idle_cb);
  ASSERT(r == 0);

  r = uv_check_init(uv_default_loop(), &check_handle);
  ASSERT(r == 0);
  r = uv_check_start(&check_handle, check_cb);
  ASSERT(r == 0);

  r = uv_timer_init(uv_default_loop(), &timer_handle);
  ASSERT(r == 0);
  r = uv_timer_start(&timer_handle, timer_cb, 50, 0);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(idle_cb_called > 0);
  ASSERT(timer_cb_called == 1);
  ASSERT(close_cb_called == 3);

  MAKE_VALGRIND_HAPPY();
  return 0;
}